

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# assert.cpp
# Opt level: O3

void duckdb::DuckDBAssertInternal(bool condition,char *condition_name,char *file,int linenr)

{
  InternalException *this;
  undefined7 in_register_00000039;
  string local_50;
  
  if ((int)CONCAT71(in_register_00000039,condition) != 0) {
    return;
  }
  this = (InternalException *)__cxa_allocate_exception(0x10);
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  ::std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_50,"Assertion triggered in file \"%s\" on line %d: %s","");
  InternalException::InternalException<char_const*,int,char_const*>
            (this,&local_50,file,linenr,condition_name);
  __cxa_throw(this,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
}

Assistant:

void DuckDBAssertInternal(bool condition, const char *condition_name, const char *file, int linenr) {
#ifdef DISABLE_ASSERTIONS
	return;
#endif
	if (condition) {
		return;
	}
	throw InternalException("Assertion triggered in file \"%s\" on line %d: %s", file, linenr, condition_name);
}